

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O0

int __thiscall KParser::_statement(KParser *this,int begin,BlockInfo *bi)

{
  int iVar1;
  int iVar2;
  BlockInfo local_280;
  BlockInfo local_240;
  BlockInfo local_200;
  BlockInfo local_1c0;
  BlockInfo local_180;
  BlockInfo local_140;
  BlockInfo local_100;
  BlockInfo local_c0;
  BlockInfo local_70;
  int local_30;
  int local_2c;
  int t;
  int i;
  BlockInfo *bi_local;
  KParser *pKStack_18;
  int begin_local;
  KParser *this_local;
  
  local_30 = 0;
  local_2c = begin;
  _t = bi;
  bi_local._4_4_ = begin;
  pKStack_18 = this;
  BlockInfo::BlockInfo(&local_70,bi);
  iVar1 = _if(this,begin,&local_70);
  local_30 = iVar1;
  BlockInfo::~BlockInfo(&local_70);
  iVar2 = local_2c;
  if (iVar1 < 0) {
    BlockInfo::BlockInfo(&local_c0,bi);
    iVar1 = _while(this,iVar2,&local_c0);
    local_30 = iVar1;
    BlockInfo::~BlockInfo(&local_c0);
    iVar2 = local_2c;
    if (iVar1 < 0) {
      BlockInfo::BlockInfo(&local_100,bi);
      iVar1 = _assign(this,iVar2,&local_100);
      local_30 = iVar1;
      BlockInfo::~BlockInfo(&local_100);
      iVar2 = local_2c;
      if (iVar1 < 0) {
        BlockInfo::BlockInfo(&local_140,bi);
        iVar1 = _decassign(this,iVar2,&local_140);
        local_30 = iVar1;
        BlockInfo::~BlockInfo(&local_140);
        iVar2 = local_2c;
        if (iVar1 < 0) {
          BlockInfo::BlockInfo(&local_180,bi);
          iVar1 = _block(this,iVar2,&local_180);
          local_30 = iVar1;
          BlockInfo::~BlockInfo(&local_180);
          iVar2 = local_2c;
          if (iVar1 < 0) {
            BlockInfo::BlockInfo(&local_1c0,bi);
            iVar1 = _break(this,iVar2,&local_1c0);
            local_30 = iVar1;
            BlockInfo::~BlockInfo(&local_1c0);
            iVar2 = local_2c;
            if (iVar1 < 0) {
              BlockInfo::BlockInfo(&local_200,bi);
              iVar1 = _continue(this,iVar2,&local_200);
              local_30 = iVar1;
              BlockInfo::~BlockInfo(&local_200);
              iVar2 = local_2c;
              if (iVar1 < 0) {
                BlockInfo::BlockInfo(&local_240,bi);
                iVar1 = _simple_expr(this,iVar2,&local_240);
                local_30 = iVar1;
                BlockInfo::~BlockInfo(&local_240);
                iVar2 = local_2c;
                if (iVar1 < 0) {
                  BlockInfo::BlockInfo(&local_280,bi);
                  iVar2 = _return(this,iVar2,&local_280);
                  local_30 = iVar2;
                  BlockInfo::~BlockInfo(&local_280);
                  if (iVar2 < 0) {
                    return -1;
                  }
                  local_2c = local_30;
                }
                else {
                  local_2c = local_30;
                }
              }
              else {
                local_2c = local_30;
              }
            }
            else {
              local_2c = local_30;
            }
          }
          else {
            local_2c = local_30;
          }
        }
        else {
          local_2c = local_30;
        }
      }
      else {
        local_2c = local_30;
      }
    }
    else {
      local_2c = local_30;
    }
  }
  else {
    local_2c = local_30;
  }
  return local_2c;
}

Assistant:

int KParser::_statement(int begin,  BlockInfo bi) {
    int i = begin;
    int t = 0;
    if((t = _if(i, bi)) >= 0) {
        i = t;
    } else if((t = _while(i, bi)) >= 0) {
        i = t;
    }else if((t = _assign(i, bi)) >= 0) {
        i = t;
    } else if((t = _decassign(i, bi)) >= 0) {
        i = t;
    } else if((t = _block(i, bi)) >= 0) {
        i = t;
    } else if((t = _break(i, bi)) >= 0) {
        i = t;
    } else if((t = _continue(i, bi)) >= 0) {
        i = t;
    }else if((t = _simple_expr(i, bi)) >= 0) {
        i = t;
    } else if((t = _return(i, bi)) >= 0) {
        i = t;
    } else {
        return -1;
    }
    return i;
}